

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomFont::write(DomFont *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffba8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffbb0;
  QAnyStringView *in_stack_fffffffffffffbb8;
  QAnyStringView *in_stack_fffffffffffffbc0;
  QAnyStringView *in_stack_fffffffffffffbc8;
  QAnyStringView *local_380;
  QAnyStringView *local_348;
  QAnyStringView *local_2f8;
  QAnyStringView *local_2c0;
  QAnyStringView *local_270;
  QAnyStringView *local_220;
  QAnyStringView *local_1d0;
  QAnyStringView *local_180;
  QAnyStringView *local_130;
  undefined1 local_120 [64];
  QAnyStringView *local_e0;
  undefined1 local_d0 [64];
  QAnyStringView *local_90;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1b81cb);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"font",4);
    QString::QString((QString *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffba8);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1b8290);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffbb0);
  }
  if ((this->m_children & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_58);
    QString::~QString((QString *)0x1b8341);
  }
  if ((this->m_children & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QString::number((int)local_d0,this->m_pointSize);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_90);
    QString::~QString((QString *)0x1b83f5);
    QString::~QString((QString *)0x1b8402);
  }
  if ((this->m_children & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QString::number((int)local_120,this->m_weight);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_e0);
    QString::~QString((QString *)0x1b84b6);
    QString::~QString((QString *)0x1b84c3);
  }
  if ((this->m_children & 8) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    if ((this->m_italic & 1U) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_130);
    QString::~QString((QString *)0x1b859c);
    QString::~QString((QString *)0x1b85a9);
  }
  if ((this->m_children & 0x10) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    if ((this->m_bold & 1U) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_180);
    QString::~QString((QString *)0x1b8682);
    QString::~QString((QString *)0x1b868f);
  }
  if ((this->m_children & 0x20) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    if ((this->m_underline & 1U) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_1d0);
    QString::~QString((QString *)0x1b8768);
    QString::~QString((QString *)0x1b8775);
  }
  if ((this->m_children & 0x40) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    if ((this->m_strikeOut & 1U) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_220);
    QString::~QString((QString *)0x1b884e);
    QString::~QString((QString *)0x1b885b);
  }
  if ((this->m_children & 0x80) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    if ((this->m_antialiasing & 1U) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_270);
    QString::~QString((QString *)0x1b8936);
    QString::~QString((QString *)0x1b8943);
  }
  if ((this->m_children & 0x100) != 0) {
    in_stack_fffffffffffffbc8 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffbc8,local_2c0);
    QString::~QString((QString *)0x1b89e0);
  }
  if ((this->m_children & 0x200) != 0) {
    in_stack_fffffffffffffbc0 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)str_00);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    if ((this->m_kerning & 1U) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    }
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffbc0,local_2f8);
    QString::~QString((QString *)0x1b8abb);
    QString::~QString((QString *)0x1b8ac8);
  }
  if ((this->m_children & 0x400) != 0) {
    in_stack_fffffffffffffbb8 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffbb8,local_348);
    QString::~QString((QString *)0x1b8b65);
  }
  if ((this->m_children & 0x800) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_380);
    QString::~QString((QString *)0x1b8c02);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomFont::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("font") : tagName.toLower());

    if (m_children & Family)
        writer.writeTextElement(u"family"_s, m_family);

    if (m_children & PointSize)
        writer.writeTextElement(u"pointsize"_s, QString::number(m_pointSize));

    if (m_children & Weight)
        writer.writeTextElement(u"weight"_s, QString::number(m_weight));

    if (m_children & Italic)
        writer.writeTextElement(u"italic"_s, (m_italic ? u"true"_s : u"false"_s));

    if (m_children & Bold)
        writer.writeTextElement(u"bold"_s, (m_bold ? u"true"_s : u"false"_s));

    if (m_children & Underline)
        writer.writeTextElement(u"underline"_s, (m_underline ? u"true"_s : u"false"_s));

    if (m_children & StrikeOut)
        writer.writeTextElement(u"strikeout"_s, (m_strikeOut ? u"true"_s : u"false"_s));

    if (m_children & Antialiasing)
        writer.writeTextElement(u"antialiasing"_s, (m_antialiasing ? u"true"_s : u"false"_s));

    if (m_children & StyleStrategy)
        writer.writeTextElement(u"stylestrategy"_s, m_styleStrategy);

    if (m_children & Kerning)
        writer.writeTextElement(u"kerning"_s, (m_kerning ? u"true"_s : u"false"_s));

    if (m_children & HintingPreference)
        writer.writeTextElement(u"hintingpreference"_s, m_hintingPreference);

    if (m_children & FontWeight)
        writer.writeTextElement(u"fontweight"_s, m_fontWeight);

    writer.writeEndElement();
}